

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoaderU.h
# Opt level: O2

void __thiscall
chrono::ChLoaderUdistributed::ChLoaderUdistributed
          (ChLoaderUdistributed *this,shared_ptr<chrono::ChLoadableU> *mloadable)

{
  __shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,
             &mloadable->super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>);
  ChLoaderU::ChLoaderU(&this->super_ChLoaderU,(shared_ptr<chrono::ChLoadableU> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  (this->super_ChLoaderU).super_ChLoader._vptr_ChLoader = (_func_int **)&PTR__ChLoaderU_00145e60;
  return;
}

Assistant:

ChLoaderUdistributed(std::shared_ptr<ChLoadableU> mloadable) : ChLoaderU(mloadable) {}